

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall duckdb::BaseAppender::Append(BaseAppender *this,char *value,uint32_t length)

{
  string_t input;
  char *pcVar1;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  if (length < 0xd) {
    uStack_10._4_4_ = 0;
    uStack_14 = 0;
    uStack_10._0_4_ = 0;
    pcVar1 = (char *)0x0;
    if (length != 0) {
      switchD_015ff80e::default(&uStack_14,value,(ulong)length);
      pcVar1 = (char *)CONCAT44(uStack_10._4_4_,(undefined4)uStack_10);
    }
  }
  else {
    uStack_14 = *(undefined4 *)value;
    pcVar1 = value;
  }
  uStack_10._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  uStack_10._0_4_ = SUB84(pcVar1,0);
  input.value._4_1_ = (undefined1)uStack_14;
  input.value._5_1_ = uStack_14._1_1_;
  input.value._6_1_ = uStack_14._2_1_;
  input.value._7_1_ = uStack_14._3_1_;
  input.value.pointer.length = length;
  input.value._8_4_ = (undefined4)uStack_10;
  input.value._12_4_ = uStack_10._4_4_;
  uStack_10 = pcVar1;
  AppendValueInternal<duckdb::string_t>(this,input);
  return;
}

Assistant:

void BaseAppender::Append(const char *value, uint32_t length) {
	AppendValueInternal<string_t>(string_t(value, length));
}